

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

ElementDocument * __thiscall Rml::Context::CreateDocument(Context *this,String *instancer_name)

{
  char *pcVar1;
  Element *pEVar2;
  ElementDocument *document;
  pointer *__ptr;
  _Head_base<0UL,_Rml::Element_*,_false> local_48;
  Element *local_40;
  XMLAttributes local_38;
  
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement
            ((Factory *)&local_40,(Element *)0x0,instancer_name,&this->documents_base_tag,&local_38)
  ;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_38.m_container);
  pEVar2 = local_40;
  if (local_40 == (Element *)0x0) {
    document = (ElementDocument *)0x0;
    Log::Message(LT_ERROR,
                 "Failed to instance document on instancer_name \'%s\', instancer returned nullptr."
                 ,(instancer_name->_M_dataplus)._M_p);
  }
  else {
    document = (ElementDocument *)
               __dynamic_cast(local_40,&Element::typeinfo,&ElementDocument::typeinfo,0);
    if (document == (ElementDocument *)0x0) {
      pcVar1 = *(char **)((pEVar2->super_ScriptInterface).super_Releasable._vptr_Releasable[-1] + 8)
      ;
      document = (ElementDocument *)0x0;
      Log::Message(LT_ERROR,
                   "Failed to instance document on instancer_name \'%s\', Found type \'%s\', was expecting derivative of ElementDocument."
                   ,(instancer_name->_M_dataplus)._M_p,pcVar1 + (*pcVar1 == '*'));
    }
    else {
      document->context = this;
      local_48._M_head_impl = pEVar2;
      local_40 = (Element *)0x0;
      Element::AppendChild
                ((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                 ._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(ElementPtr *)&local_48,
                 true);
      if (local_48._M_head_impl != (Element *)0x0) {
        (*((local_48._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
      }
      local_48._M_head_impl = (Element *)0x0;
      PluginRegistry::NotifyDocumentLoad(document);
    }
  }
  if (local_40 != (Element *)0x0) {
    (*(local_40->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
  }
  return document;
}

Assistant:

ElementDocument* Context::CreateDocument(const String& instancer_name)
{
	ElementPtr element = Factory::InstanceElement(nullptr, instancer_name, documents_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document on instancer_name '%s', instancer returned nullptr.", instancer_name.c_str());
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR,
			"Failed to instance document on instancer_name '%s', Found type '%s', was expecting derivative of ElementDocument.",
			instancer_name.c_str(), rmlui_type_name(*element));
		return nullptr;
	}

	document->context = this;
	root->AppendChild(std::move(element));

	PluginRegistry::NotifyDocumentLoad(document);

	return document;
}